

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmc_bounded_q.h
# Opt level: O0

void __thiscall
spdlog::details::mpmc_bounded_queue<spdlog::details::async_log_helper::async_msg>::
mpmc_bounded_queue(mpmc_bounded_queue<spdlog::details::async_log_helper::async_msg> *this,
                  size_t buffer_size)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  size_t *psVar3;
  spdlog_ex *this_00;
  atomic<unsigned_long> *paVar4;
  cell_t *pcVar5;
  ulong uVar6;
  cell_t *local_f0;
  __int_type_conflict1 local_b8;
  size_t i;
  string local_a8;
  size_t local_78;
  size_t buffer_size_local;
  mpmc_bounded_queue<spdlog::details::async_log_helper::async_msg> *this_local;
  int local_5c;
  memory_order __b_2;
  atomic<unsigned_long> *local_50;
  __int_type_conflict1 local_48;
  memory_order local_40;
  int local_3c;
  memory_order __b_1;
  atomic<unsigned_long> *local_30;
  __int_type_conflict1 local_28;
  memory_order local_20;
  int local_1c;
  memory_order __b;
  cell_t *local_10;
  
  this->max_size_ = buffer_size;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = buffer_size;
  uVar2 = SUB168(auVar1 * ZEXT816(0x70),0);
  uVar6 = uVar2 + 8;
  if (SUB168(auVar1 * ZEXT816(0x70),8) != 0 || 0xfffffffffffffff7 < uVar2) {
    uVar6 = 0xffffffffffffffff;
  }
  local_78 = buffer_size;
  buffer_size_local = (size_t)this;
  psVar3 = (size_t *)operator_new__(uVar6);
  *psVar3 = buffer_size;
  pcVar5 = (cell_t *)(psVar3 + 1);
  if (buffer_size != 0) {
    local_f0 = pcVar5;
    do {
      cell_t::cell_t(local_f0);
      local_f0 = local_f0 + 1;
    } while (local_f0 != pcVar5 + buffer_size);
  }
  this->buffer_ = pcVar5;
  this->buffer_mask_ = local_78 - 1;
  if ((1 < local_78) && ((local_78 & local_78 - 1) == 0)) {
    for (local_b8 = 0; local_b8 != local_78; local_b8 = local_b8 + 1) {
      pcVar5 = this->buffer_ + local_b8;
      ___b = local_b8;
      local_1c = 0;
      local_10 = pcVar5;
      local_20 = std::operator&(memory_order_relaxed,__memory_order_mask);
      local_28 = ___b;
      if (local_1c == 3) {
        (pcVar5->sequence_).super___atomic_base<unsigned_long>._M_i = ___b;
      }
      else if (local_1c == 5) {
        LOCK();
        (pcVar5->sequence_).super___atomic_base<unsigned_long>._M_i = ___b;
        UNLOCK();
      }
      else {
        (pcVar5->sequence_).super___atomic_base<unsigned_long>._M_i = ___b;
      }
    }
    paVar4 = &this->enqueue_pos_;
    ___b_1 = 0;
    local_3c = 0;
    local_30 = paVar4;
    local_40 = std::operator&(memory_order_relaxed,__memory_order_mask);
    local_48 = ___b_1;
    if (local_3c == 3) {
      (paVar4->super___atomic_base<unsigned_long>)._M_i = ___b_1;
    }
    else if (local_3c == 5) {
      LOCK();
      (paVar4->super___atomic_base<unsigned_long>)._M_i = ___b_1;
      UNLOCK();
    }
    else {
      (paVar4->super___atomic_base<unsigned_long>)._M_i = ___b_1;
    }
    paVar4 = &this->dequeue_pos_;
    ___b_2 = 0;
    local_5c = 0;
    local_50 = paVar4;
    std::operator&(memory_order_relaxed,__memory_order_mask);
    if (local_5c == 3) {
      (paVar4->super___atomic_base<unsigned_long>)._M_i = ___b_2;
    }
    else if (local_5c == 5) {
      LOCK();
      (paVar4->super___atomic_base<unsigned_long>)._M_i = ___b_2;
      UNLOCK();
    }
    else {
      (paVar4->super___atomic_base<unsigned_long>)._M_i = ___b_2;
    }
    return;
  }
  i._6_1_ = 1;
  this_00 = (spdlog_ex *)__cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"async logger queue size must be power of two",
             (allocator<char> *)((long)&i + 7));
  spdlog_ex::spdlog_ex(this_00,&local_a8);
  i._6_1_ = 0;
  __cxa_throw(this_00,&spdlog_ex::typeinfo,spdlog_ex::~spdlog_ex);
}

Assistant:

explicit mpmc_bounded_queue(size_t buffer_size)
        : max_size_(buffer_size)
        , buffer_(new cell_t[buffer_size])
        , buffer_mask_(buffer_size - 1)
    {
        // queue size must be power of two
        if (!((buffer_size >= 2) && ((buffer_size & (buffer_size - 1)) == 0)))
        {
            throw spdlog_ex("async logger queue size must be power of two");
        }

        for (size_t i = 0; i != buffer_size; i += 1)
        {
            buffer_[i].sequence_.store(i, std::memory_order_relaxed);
        }
        enqueue_pos_.store(0, std::memory_order_relaxed);
        dequeue_pos_.store(0, std::memory_order_relaxed);
    }